

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O0

XSAttributeDeclaration * __thiscall
xercesc_4_0::XSObjectFactory::addOrFind
          (XSObjectFactory *this,SchemaAttDef *attDef,XSModel *xsModel,
          XSComplexTypeDefinition *enclosingTypeDef)

{
  SCOPE SVar1;
  PSVIScope PVar2;
  XSComplexTypeDefinition *pXVar3;
  DatatypeValidator *pDVar4;
  XSAnnotation *annot;
  XSComplexTypeDefinition *local_48;
  XSComplexTypeDefinition *enclosingCTDefinition;
  XSSimpleTypeDefinition *pXStack_38;
  SCOPE scope;
  XSSimpleTypeDefinition *xsType;
  XSAttributeDeclaration *xsObj;
  XSComplexTypeDefinition *enclosingTypeDef_local;
  XSModel *xsModel_local;
  SchemaAttDef *attDef_local;
  XSObjectFactory *this_local;
  
  xsType = (XSSimpleTypeDefinition *)XSModel::getXSObject(xsModel,attDef);
  if (xsType == (XSSimpleTypeDefinition *)0x0) {
    pXStack_38 = (XSSimpleTypeDefinition *)0x0;
    pDVar4 = SchemaAttDef::getDatatypeValidator(attDef);
    if (pDVar4 != (DatatypeValidator *)0x0) {
      pDVar4 = SchemaAttDef::getDatatypeValidator(attDef);
      pXStack_38 = addOrFind(this,pDVar4,xsModel,false);
    }
    enclosingCTDefinition._4_4_ = SCOPE_ABSENT;
    local_48 = (XSComplexTypeDefinition *)0x0;
    PVar2 = SchemaAttDef::getPSVIScope(attDef);
    if (PVar2 == SCP_GLOBAL) {
      enclosingCTDefinition._4_4_ = SCOPE_GLOBAL;
    }
    else {
      PVar2 = SchemaAttDef::getPSVIScope(attDef);
      if (PVar2 == SCP_LOCAL) {
        enclosingCTDefinition._4_4_ = SCOPE_LOCAL;
        local_48 = enclosingTypeDef;
      }
    }
    xsType = (XSSimpleTypeDefinition *)XMemory::operator_new(0x50,this->fMemoryManager);
    annot = getAnnotationFromModel(this,xsModel,attDef);
    XSAttributeDeclaration::XSAttributeDeclaration
              ((XSAttributeDeclaration *)xsType,attDef,pXStack_38,annot,xsModel,
               enclosingCTDefinition._4_4_,local_48,this->fMemoryManager);
    putObjectInMap(this,attDef,(XSObject *)xsType);
  }
  else {
    SVar1 = XSAttributeDeclaration::getScope((XSAttributeDeclaration *)xsType);
    if (((SVar1 == SCOPE_LOCAL) &&
        (pXVar3 = XSAttributeDeclaration::getEnclosingCTDefinition((XSAttributeDeclaration *)xsType)
        , pXVar3 == (XSComplexTypeDefinition *)0x0)) &&
       (enclosingTypeDef != (XSComplexTypeDefinition *)0x0)) {
      XSAttributeDeclaration::setEnclosingCTDefinition
                ((XSAttributeDeclaration *)xsType,enclosingTypeDef);
    }
  }
  return (XSAttributeDeclaration *)xsType;
}

Assistant:

XSAttributeDeclaration*
XSObjectFactory::addOrFind(SchemaAttDef* const attDef,
                           XSModel* const xsModel,
                           XSComplexTypeDefinition* const enclosingTypeDef)
{
    XSAttributeDeclaration* xsObj = (XSAttributeDeclaration*) xsModel->getXSObject(attDef);
    if (xsObj)
    {
        if (xsObj->getScope() == XSConstants::SCOPE_LOCAL
            && xsObj->getEnclosingCTDefinition() == 0
            && enclosingTypeDef)
            xsObj->setEnclosingCTDefinition(enclosingTypeDef);
    }
    else
    {
        XSSimpleTypeDefinition* xsType = 0;
        if (attDef->getDatatypeValidator())
            xsType = addOrFind(attDef->getDatatypeValidator(), xsModel);

        XSConstants::SCOPE scope = XSConstants::SCOPE_ABSENT;
        XSComplexTypeDefinition* enclosingCTDefinition = 0;

        if (attDef->getPSVIScope() == PSVIDefs::SCP_GLOBAL)
            scope = XSConstants::SCOPE_GLOBAL;
        else if (attDef->getPSVIScope() == PSVIDefs::SCP_LOCAL)
        {
            scope = XSConstants::SCOPE_LOCAL;
            enclosingCTDefinition = enclosingTypeDef;
        }

        xsObj = new (fMemoryManager) XSAttributeDeclaration
        (
            attDef
            , xsType
            , getAnnotationFromModel(xsModel, attDef)
            , xsModel
            , scope
            , enclosingCTDefinition
            , fMemoryManager
        );
        putObjectInMap(attDef, xsObj);
    }

    return xsObj;
}